

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O3

int ps_alignment_populate(ps_alignment_t *al)

{
  ps_alignment_vector_t *vec;
  short sVar1;
  short sVar2;
  uint16 uVar3;
  int iVar4;
  dict2pid_t *d2p;
  bin_mdef_t *pbVar5;
  dict_t *pdVar6;
  int32 iVar7;
  s3ssid_t sVar8;
  int iVar9;
  uint uVar10;
  dictword_t *pdVar11;
  ps_alignment_entry_t *ppVar12;
  int32 iVar13;
  uint uVar14;
  ulong uVar15;
  char *fmt;
  ushort uVar16;
  int32 iVar17;
  int iVar18;
  ulong uVar19;
  ps_alignment_entry_t *ppVar20;
  long lVar21;
  
  iVar9 = 0;
  (al->sseq).n_ent = 0;
  (al->state).n_ent = 0;
  uVar16 = (al->word).n_ent;
  uVar15 = (ulong)uVar16;
  if (uVar16 != 0) {
    vec = &al->sseq;
    d2p = al->d2p;
    pbVar5 = d2p->mdef;
    iVar17 = pbVar5->sil;
    pdVar6 = d2p->dict;
    pdVar11 = pdVar6->word;
    uVar19 = 0;
    while( true ) {
      ppVar12 = (al->word).seq;
      ppVar20 = ppVar12 + uVar19;
      if (uVar19 < (int)uVar15 - 1) {
        iVar13 = (int32)*pdVar11[ppVar20[1].id.wid].ciphone;
      }
      else {
        iVar13 = pbVar5->sil;
      }
      iVar9 = ppVar12[uVar19].id.wid;
      iVar4 = pdVar11[iVar9].pronlen;
      ppVar12 = ps_alignment_vector_grow_one(vec);
      if (ppVar12 == (ps_alignment_entry_t *)0x0) break;
      sVar1 = *pdVar6->word[iVar9].ciphone;
      (ppVar12->id).pid.cipid = sVar1;
      (ppVar12->id).pid.tmatid = pbVar5->phone[sVar1].tmat;
      iVar7 = ppVar20->duration;
      ppVar12->start = ppVar20->start;
      ppVar12->duration = iVar7;
      ppVar12->score = 0;
      iVar18 = (int)uVar19;
      ppVar12->parent = iVar18;
      ppVar20->child = ((uint)((int)ppVar12 - *(int *)&vec->seq) >> 2) * -0x49249249 & 0xffff;
      sVar1 = (ppVar12->id).pid.cipid;
      if (iVar4 == 1) {
        sVar8 = d2p->lrdiph_rc[sVar1][iVar17][iVar13];
        (ppVar12->id).pid.ssid = sVar8;
        if (sVar8 == 0xffff) {
LAB_0010ec66:
          __assert_fail("sent->id.pid.ssid != BAD_SSID",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                        ,0xb2,"int ps_alignment_populate(ps_alignment_t *)");
        }
        uVar14 = 0;
        uVar10 = 1;
      }
      else {
        sVar8 = d2p->ldiph_lc[sVar1][pdVar6->word[iVar9].ciphone[1]][iVar17];
        (ppVar12->id).pid.ssid = sVar8;
        if (sVar8 == 0xffff) goto LAB_0010ec66;
        uVar14 = iVar4 - 1;
        uVar10 = 1;
        if (2 < iVar4) {
          uVar15 = 1;
          do {
            ppVar12 = ps_alignment_vector_grow_one(vec);
            if (ppVar12 == (ps_alignment_entry_t *)0x0) {
              fmt = "Failed to add phone entry!\n";
              lVar21 = 0xb7;
              goto LAB_0010ec23;
            }
            sVar1 = pdVar6->word[iVar9].ciphone[uVar15];
            (ppVar12->id).pid.cipid = sVar1;
            (ppVar12->id).pid.tmatid = pbVar5->phone[sVar1].tmat;
            sVar8 = dict2pid_internal(d2p,iVar9,(int)uVar15);
            (ppVar12->id).pid.ssid = sVar8;
            if (sVar8 == 0xffff) {
              __assert_fail("sent->id.pid.ssid != BAD_SSID",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                            ,0xbd,"int ps_alignment_populate(ps_alignment_t *)");
            }
            iVar17 = ppVar20->duration;
            ppVar12->start = ppVar20->start;
            ppVar12->duration = iVar17;
            ppVar12->score = 0;
            ppVar12->parent = iVar18;
            uVar15 = uVar15 + 1;
            uVar10 = uVar14;
          } while (uVar14 != uVar15);
        }
      }
      if ((int)uVar10 < iVar4) {
        if (uVar10 != uVar14) {
          __assert_fail("j == len - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                        ,199,"int ps_alignment_populate(ps_alignment_t *)");
        }
        ppVar12 = ps_alignment_vector_grow_one(vec);
        if (ppVar12 == (ps_alignment_entry_t *)0x0) {
          fmt = "Failed to add phone entry!\n";
          lVar21 = 0xc9;
          goto LAB_0010ec23;
        }
        sVar1 = pdVar6->word[iVar9].ciphone[(long)pdVar6->word[iVar9].pronlen + -1];
        (ppVar12->id).pid.cipid = sVar1;
        (ppVar12->id).pid.tmatid = pbVar5->phone[sVar1].tmat;
        sVar2 = pdVar6->word[iVar9].ciphone[(long)pdVar6->word[iVar9].pronlen + -2];
        sVar8 = d2p->rssid[sVar1][sVar2].ssid[d2p->rssid[sVar1][sVar2].cimap[iVar13]];
        (ppVar12->id).pid.ssid = sVar8;
        if (sVar8 == 0xffff) {
          __assert_fail("sent->id.pid.ssid != BAD_SSID",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                        ,0xd1,"int ps_alignment_populate(ps_alignment_t *)");
        }
        iVar17 = ppVar20->duration;
        ppVar12->start = ppVar20->start;
        ppVar12->duration = iVar17;
        ppVar12->score = 0;
        ppVar12->parent = iVar18;
      }
      pdVar11 = pdVar6->word;
      iVar17 = (int32)pdVar11[iVar9].ciphone[(long)pdVar11[iVar9].pronlen + -1];
      uVar19 = uVar19 + 1;
      uVar15 = (ulong)(al->word).n_ent;
      if (uVar15 <= uVar19) {
        uVar16 = (al->sseq).n_ent;
        if (uVar16 == 0) {
          return 0;
        }
        uVar15 = (ulong)(uint)pbVar5->n_emit_state;
        uVar19 = 0;
        do {
          if (0 < (int)uVar15) {
            ppVar20 = vec->seq + uVar19;
            lVar21 = 0;
            do {
              ppVar12 = ps_alignment_vector_grow_one(&al->state);
              if (ppVar12 == (ps_alignment_entry_t *)0x0) {
                fmt = "Failed to add state entry!\n";
                lVar21 = 0xe6;
                goto LAB_0010ec23;
              }
              uVar3 = pbVar5->sseq[(ppVar20->id).pid.ssid][lVar21];
              (ppVar12->id).pid.cipid = uVar3;
              if (uVar3 == 0xffff) {
                __assert_fail("sent->id.senid != BAD_SENID",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                              ,0xea,"int ps_alignment_populate(ps_alignment_t *)");
              }
              iVar17 = ppVar20->duration;
              ppVar12->start = ppVar20->start;
              ppVar12->duration = iVar17;
              ppVar12->score = 0;
              ppVar12->parent = (int)uVar19;
              if (lVar21 == 0) {
                ppVar20->child =
                     ((uint)((int)ppVar12 - *(int *)&(al->state).seq) >> 2) * -0x49249249 & 0xffff;
              }
              lVar21 = lVar21 + 1;
              uVar15 = (ulong)pbVar5->n_emit_state;
            } while (lVar21 < (long)uVar15);
            uVar16 = (al->sseq).n_ent;
          }
          uVar19 = uVar19 + 1;
          if (uVar16 <= uVar19) {
            return 0;
          }
        } while( true );
      }
    }
    fmt = "Failed to add phone entry!\n";
    lVar21 = 0xa1;
LAB_0010ec23:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
            ,lVar21,fmt);
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int
ps_alignment_populate(ps_alignment_t *al)
{
    dict2pid_t *d2p;
    dict_t *dict;
    bin_mdef_t *mdef;
    int i, lc;

    /* Clear phone and state sequences. */
    ps_alignment_vector_empty(&al->sseq);
    ps_alignment_vector_empty(&al->state);

    /* For each word, expand to phones/senone sequences. */
    d2p = al->d2p;
    dict = d2p->dict;
    mdef = d2p->mdef;
    lc = bin_mdef_silphone(mdef);
    for (i = 0; i < al->word.n_ent; ++i) {
        ps_alignment_entry_t *went = al->word.seq + i;
        ps_alignment_entry_t *sent;
        int wid = went->id.wid;
        int len = dict_pronlen(dict, wid);
        int j, rc;

        if (i < al->word.n_ent - 1)
            rc = dict_first_phone(dict, al->word.seq[i+1].id.wid);
        else
            rc = bin_mdef_silphone(mdef);

        /* First phone. */
        if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
            E_ERROR("Failed to add phone entry!\n");
            return -1;
        }
        sent->id.pid.cipid = dict_first_phone(dict, wid);
        sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
        sent->start = went->start;
        sent->duration = went->duration;
        sent->score = 0;
        sent->parent = i;
        went->child = (uint16)(sent - al->sseq.seq);
        if (len == 1)
            sent->id.pid.ssid
                = dict2pid_lrdiph_rc(d2p, sent->id.pid.cipid, lc, rc);
        else
            sent->id.pid.ssid
                = dict2pid_ldiph_lc(d2p, sent->id.pid.cipid,
                                    dict_second_phone(dict, wid), lc);
        assert(sent->id.pid.ssid != BAD_SSID);

        /* Internal phones. */
        for (j = 1; j < len - 1; ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_pron(dict, wid, j);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            sent->id.pid.ssid = dict2pid_internal(d2p, wid, j);
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }

        /* Last phone. */
        if (j < len) {
            xwdssid_t *rssid;
            assert(j == len - 1);
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_last_phone(dict, wid);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            rssid = dict2pid_rssid(d2p, sent->id.pid.cipid,
                                   dict_second_last_phone(dict, wid));
            sent->id.pid.ssid = rssid->ssid[rssid->cimap[rc]];
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }
        /* Update lc.  Could just use sent->id.pid.cipid here but that
         * seems needlessly obscure. */
        lc = dict_last_phone(dict, wid);
    }

    /* For each senone sequence, expand to senones.  (we could do this
     * nested above but this makes it more clear and easier to
     * refactor) */
    for (i = 0; i < al->sseq.n_ent; ++i) {
        ps_alignment_entry_t *pent = al->sseq.seq + i;
        ps_alignment_entry_t *sent;
        int j;

        for (j = 0; j < bin_mdef_n_emit_state(mdef); ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->state)) == NULL) {
                E_ERROR("Failed to add state entry!\n");
                return -1;
            }
            sent->id.senid = bin_mdef_sseq2sen(mdef, pent->id.pid.ssid, j);
            assert(sent->id.senid != BAD_SENID);
            sent->start = pent->start;
            sent->duration = pent->duration;
            sent->score = 0;
            sent->parent = i;
            if (j == 0)
                pent->child = (uint16)(sent - al->state.seq);
        }
    }

    return 0;
}